

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmForEachCommand.cxx
# Opt level: O0

bool __thiscall
cmForEachCommand::InitialPass
          (cmForEachCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *this_00;
  cmExecutionStatus *pcVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  char *pcVar5;
  ostream *poVar6;
  pointer pcVar7;
  uint local_29c;
  char local_298 [4];
  int cc;
  char buffer [100];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  range;
  string local_210;
  undefined1 local_1f0 [8];
  ostringstream str;
  int local_74;
  uint local_70;
  int step;
  int stop;
  int start;
  __single_object f;
  allocator<char> local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmForEachCommand *this_local;
  
  local_28 = param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(args);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"called with incorrect number of arguments",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    this_local._7_1_ = 0;
    goto LAB_00279094;
  }
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)param_2_local);
  if (1 < sVar3) {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_2_local,1);
    bVar2 = std::operator==(pvVar4,"IN");
    if (bVar2) {
      this_local._7_1_ =
           HandleInMode(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)param_2_local);
      goto LAB_00279094;
    }
  }
  std::make_unique<cmForEachFunctionBlocker,cmMakefile*&>((cmMakefile **)&stop);
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)param_2_local);
  pcVar1 = param_2_local;
  if (sVar3 < 2) {
    pcVar7 = std::
             unique_ptr<cmForEachFunctionBlocker,_std::default_delete<cmForEachFunctionBlocker>_>::
             operator->((unique_ptr<cmForEachFunctionBlocker,_std::default_delete<cmForEachFunctionBlocker>_>
                         *)&stop);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&pcVar7->Args,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)pcVar1);
LAB_00279044:
    this_00 = (this->super_cmCommand).Makefile;
    pcVar7 = std::
             unique_ptr<cmForEachFunctionBlocker,_std::default_delete<cmForEachFunctionBlocker>_>::
             release((unique_ptr<cmForEachFunctionBlocker,_std::default_delete<cmForEachFunctionBlocker>_>
                      *)&stop);
    cmMakefile::AddFunctionBlocker(this_00,&pcVar7->super_cmFunctionBlocker);
    this_local._7_1_ = 1;
  }
  else {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_2_local,1);
    bVar2 = std::operator==(pvVar4,"RANGE");
    pcVar1 = param_2_local;
    if (!bVar2) {
      pcVar7 = std::
               unique_ptr<cmForEachFunctionBlocker,_std::default_delete<cmForEachFunctionBlocker>_>
               ::operator->((unique_ptr<cmForEachFunctionBlocker,_std::default_delete<cmForEachFunctionBlocker>_>
                             *)&stop);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&pcVar7->Args,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)pcVar1);
      goto LAB_00279044;
    }
    step = 0;
    local_70 = 0;
    local_74 = 0;
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)param_2_local);
    if (sVar3 == 3) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)param_2_local,2);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      local_70 = atoi(pcVar5);
    }
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)param_2_local);
    if (sVar3 == 4) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)param_2_local,2);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      step = atoi(pcVar5);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)param_2_local,3);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      local_70 = atoi(pcVar5);
    }
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)param_2_local);
    if (sVar3 == 5) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)param_2_local,2);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      step = atoi(pcVar5);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)param_2_local,3);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      local_70 = atoi(pcVar5);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)param_2_local,4);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      local_74 = atoi(pcVar5);
    }
    if (local_74 == 0) {
      if ((int)local_70 < step) {
        local_74 = -1;
      }
      else {
        local_74 = 1;
      }
    }
    if ((((step <= (int)local_70) || (local_74 < 1)) && (((int)local_70 <= step || (-1 < local_74)))
        ) && (local_74 != 0)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(buffer + 0x60));
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)param_2_local,0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(buffer + 0x60),pvVar4);
      for (local_29c = step;
          ((local_74 < 1 || ((int)local_29c <= (int)local_70)) &&
          ((-1 < local_74 || ((int)local_70 <= (int)local_29c)))); local_29c = local_74 + local_29c)
      {
        sprintf(local_298,"%d",(ulong)local_29c);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char(&)[100]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   (buffer + 0x60),(char (*) [100])local_298);
        if (local_29c == local_70) break;
      }
      pcVar7 = std::
               unique_ptr<cmForEachFunctionBlocker,_std::default_delete<cmForEachFunctionBlocker>_>
               ::operator->((unique_ptr<cmForEachFunctionBlocker,_std::default_delete<cmForEachFunctionBlocker>_>
                             *)&stop);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&pcVar7->Args,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(buffer + 0x60));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(buffer + 0x60));
      goto LAB_00279044;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
    std::operator<<((ostream *)local_1f0,"called with incorrect range specification: start ");
    poVar6 = (ostream *)std::ostream::operator<<(local_1f0,step);
    poVar6 = std::operator<<(poVar6,", stop ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_70);
    poVar6 = std::operator<<(poVar6,", step ");
    std::ostream::operator<<(poVar6,local_74);
    std::__cxx11::ostringstream::str();
    cmCommand::SetError(&this->super_cmCommand,&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    this_local._7_1_ = 0;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f0);
  }
  std::unique_ptr<cmForEachFunctionBlocker,_std::default_delete<cmForEachFunctionBlocker>_>::
  ~unique_ptr((unique_ptr<cmForEachFunctionBlocker,_std::default_delete<cmForEachFunctionBlocker>_>
               *)&stop);
LAB_00279094:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmForEachCommand::InitialPass(std::vector<std::string> const& args,
                                   cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  if (args.size() > 1 && args[1] == "IN") {
    return this->HandleInMode(args);
  }

  // create a function blocker
  auto f = cm::make_unique<cmForEachFunctionBlocker>(this->Makefile);
  if (args.size() > 1) {
    if (args[1] == "RANGE") {
      int start = 0;
      int stop = 0;
      int step = 0;
      if (args.size() == 3) {
        stop = atoi(args[2].c_str());
      }
      if (args.size() == 4) {
        start = atoi(args[2].c_str());
        stop = atoi(args[3].c_str());
      }
      if (args.size() == 5) {
        start = atoi(args[2].c_str());
        stop = atoi(args[3].c_str());
        step = atoi(args[4].c_str());
      }
      if (step == 0) {
        if (start > stop) {
          step = -1;
        } else {
          step = 1;
        }
      }
      if ((start > stop && step > 0) || (start < stop && step < 0) ||
          step == 0) {
        std::ostringstream str;
        str << "called with incorrect range specification: start ";
        str << start << ", stop " << stop << ", step " << step;
        this->SetError(str.str());
        return false;
      }
      std::vector<std::string> range;
      char buffer[100];
      range.push_back(args[0]);
      int cc;
      for (cc = start;; cc += step) {
        if ((step > 0 && cc > stop) || (step < 0 && cc < stop)) {
          break;
        }
        sprintf(buffer, "%d", cc);
        range.emplace_back(buffer);
        if (cc == stop) {
          break;
        }
      }
      f->Args = range;
    } else {
      f->Args = args;
    }
  } else {
    f->Args = args;
  }
  this->Makefile->AddFunctionBlocker(f.release());

  return true;
}